

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTests.cpp
# Opt level: O1

int __thiscall glcts::TextureBorderClampTests::init(TextureBorderClampTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TextureBorderClampParameterBorderColorErrorTest *this_00;
  TextureBorderClampTexParameterIErrorsTest *this_01;
  TextureBorderClampGetTexParameterIErrorsTest *this_02;
  TextureBorderClampSamplerParameterIErrorTest *this_03;
  TextureBorderClampSamplerParameterIWithWrongPnameTest *this_04;
  TextureBorderClampParameterTextureBorderColor *this_05;
  TextureBorderClampSamplingTexture<float,_unsigned_char> *pTVar1;
  TextureBorderClampSamplingTexture<int,_int> *pTVar2;
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *pTVar3;
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *pTVar4;
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *pTVar5;
  TestConfiguration<float,_unsigned_char> configurationTexture3DRGBA32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayCompressedLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayRGBA32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DCompressedLinear;
  TestConfiguration<unsigned_short,_unsigned_char> configurationTexture2DDC16Linear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DDC32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture2DRGBA32FLinear;
  TestConfiguration<float,_unsigned_char> configurationTexture3DRGBA32F;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayCompressed;
  TestConfiguration<float,_unsigned_char> configurationTexture2DArrayRGBA32F;
  TestConfiguration<float,_unsigned_char> configurationTexture2DCompressed;
  TestConfiguration<unsigned_short,_unsigned_char> configurationTexture2DDC16;
  TestConfiguration<float,_unsigned_char> configurationTexture2DDC32F;
  TestConfiguration<float,_unsigned_char> configurationTexture2DRGBA32F;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture3DRGBA8Linear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DArrayRGBA8Linear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DRGBA8Linear;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture3DRGBA8;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DArrayRGBA8;
  TestConfiguration<unsigned_char,_unsigned_char> configurationTexture2DRGBA8;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture3DR32UI;
  TestConfiguration<int,_int> configurationTexture3DR32I;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture2DArrayR32UI;
  TestConfiguration<int,_int> configurationTexture2DArrayR32I;
  TestConfiguration<unsigned_int,_unsigned_int> configurationTexture2DR32UI;
  TestConfiguration<int,_int> configurationTexture2DR32I;
  TestConfiguration<float,_unsigned_char> local_780;
  TestConfiguration<float,_unsigned_char> local_738;
  TestConfiguration<float,_unsigned_char> local_6f0;
  TestConfiguration<float,_unsigned_char> local_6a8;
  undefined1 local_660 [16];
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined2 local_628;
  undefined8 local_624;
  undefined1 local_618 [16];
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  undefined2 local_5dc;
  undefined8 local_5d8;
  TestConfiguration<float,_unsigned_char> local_5d0;
  TestConfiguration<float,_unsigned_char> local_588;
  TestConfiguration<float,_unsigned_char> local_540;
  TestConfiguration<float,_unsigned_char> local_4f8;
  TestConfiguration<float,_unsigned_char> local_4b0;
  undefined1 local_468 [16];
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined2 local_430;
  undefined8 local_42c;
  undefined1 local_420 [16];
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  undefined2 local_3e4;
  undefined8 local_3e0;
  TestConfiguration<float,_unsigned_char> local_3d8;
  TestConfiguration<unsigned_char,_unsigned_char> local_390;
  TestConfiguration<unsigned_char,_unsigned_char> local_350;
  TestConfiguration<unsigned_char,_unsigned_char> local_310;
  TestConfiguration<unsigned_char,_unsigned_char> local_2d0;
  TestConfiguration<unsigned_char,_unsigned_char> local_290;
  TestConfiguration<unsigned_char,_unsigned_char> local_250;
  TestConfiguration<unsigned_int,_unsigned_int> local_210;
  TestConfiguration<int,_int> local_1c0;
  TestConfiguration<unsigned_int,_unsigned_int> local_170;
  TestConfiguration<int,_int> local_120;
  TestConfiguration<unsigned_int,_unsigned_int> local_d0;
  TestConfiguration<int,_int> local_80;
  
  tcu::TestNode::init((TestNode *)this,ctx);
  this_00 = (TextureBorderClampParameterBorderColorErrorTest *)operator_new(0x2f0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TextureBorderClampParameterBorderColorErrorTest::TextureBorderClampParameterBorderColorErrorTest
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams,"border_color_errors",
             "Test 1");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TextureBorderClampTexParameterIErrorsTest *)operator_new(0x2f0);
  TextureBorderClampTexParameterIErrorsTest::TextureBorderClampTexParameterIErrorsTest
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams,"texparameteri_errors",
             "Test 2");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TextureBorderClampGetTexParameterIErrorsTest *)operator_new(0x308);
  TextureBorderClampGetTexParameterIErrorsTest::TextureBorderClampGetTexParameterIErrorsTest
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams,"gettexparameteri_errors",
             "Test 3");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TextureBorderClampSamplerParameterIErrorTest *)operator_new(0x308);
  TextureBorderClampSamplerParameterIErrorTest::TextureBorderClampSamplerParameterIErrorTest
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams,
             "samplerparameteri_non_gen_sampler_error","Test 4");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TextureBorderClampSamplerParameterIWithWrongPnameTest *)operator_new(0x308);
  TextureBorderClampSamplerParameterIWithWrongPnameTest::
  TextureBorderClampSamplerParameterIWithWrongPnameTest
            (this_04,(this->super_TestCaseGroupBase).m_context,extParams,
             "samplerparameteri_with_wrong_pname","Test 5");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (TextureBorderClampParameterTextureBorderColor *)operator_new(0x310);
  TextureBorderClampParameterTextureBorderColor::TextureBorderClampParameterTextureBorderColor
            (this_05,(this->super_TestCaseGroupBase).m_context,extParams,
             "samplerparameteri_border_color","Test 6");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  local_3d8._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_3d8.m_n_in_components = 4;
  local_3d8.m_n_out_components = 4;
  local_3d8.m_target = 0xde1;
  local_3d8.m_input_internal_format = 0x8814;
  local_3d8.m_output_internal_format = 0x8058;
  local_3d8.m_filtering = 0x2600;
  local_3d8.m_input_format = 0x1908;
  local_3d8.m_output_format = 0x1908;
  local_3d8.m_width = 0x100;
  local_3d8.m_height = 0x100;
  local_3d8.m_depth = 1;
  local_3d8.m_init_value = 0.0;
  local_3d8.m_init_border_color = 1.0;
  local_3d8.m_expected_value = '\0';
  local_3d8.m_expected_border_color = 0xff;
  local_3d8.m_input_type = 0x1406;
  local_3d8.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DRGBA32F","Test 7",
             &local_3d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_80._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021553a8;
  local_80.m_n_in_components = 1;
  local_80.m_n_out_components = 4;
  local_80.m_target = 0xde1;
  local_80.m_input_internal_format = 0x8235;
  local_80.m_output_internal_format = 0x8235;
  local_80.m_filtering = 0x2600;
  local_80.m_input_format = 0x8d94;
  local_80.m_output_format = 0x8d99;
  local_80.m_width = 0x100;
  local_80.m_height = 0x100;
  local_80.m_depth = 1;
  local_80.m_init_value = 0;
  local_80.m_init_border_color = 0xff;
  local_80.m_expected_value = 0;
  local_80.m_expected_border_color = 0xff;
  local_80.m_input_type = 0x1404;
  local_80.m_output_type = 0x1404;
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DR32I","Test 7",
             &local_80);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_d0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155428;
  local_d0.m_n_in_components = 1;
  local_d0.m_n_out_components = 4;
  local_d0.m_target = 0xde1;
  local_d0.m_input_internal_format = 0x8236;
  local_d0.m_output_internal_format = 0x8236;
  local_d0.m_filtering = 0x2600;
  local_d0.m_input_format = 0x8d94;
  local_d0.m_output_format = 0x8d99;
  local_d0.m_width = 0x100;
  local_d0.m_height = 0x100;
  local_d0.m_depth = 1;
  local_d0.m_init_value = 0;
  local_d0.m_init_border_color = 0xff;
  local_d0.m_expected_value = 0;
  local_d0.m_expected_border_color = 0xff;
  local_d0.m_input_type = 0x1405;
  local_d0.m_output_type = 0x1405;
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DR32UI","Test 7",
             &local_d0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  local_250._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_250.m_n_in_components = 4;
  local_250.m_n_out_components = 4;
  local_250.m_target = 0xde1;
  local_250.m_input_internal_format = 0x8058;
  local_250.m_output_internal_format = 0x8058;
  local_250.m_filtering = 0x2600;
  local_250.m_input_format = 0x1908;
  local_250.m_output_format = 0x1908;
  local_250.m_width = 0x100;
  local_250.m_height = 0x100;
  local_250.m_depth = 1;
  local_250.m_init_value = '\0';
  local_250.m_init_border_color = 0xff;
  local_250.m_expected_value = '\0';
  local_250.m_expected_border_color = 0xff;
  local_250.m_input_type = 0x1401;
  local_250.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DRGBA8","Test 7",
             &local_250);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_420._0_8_ = &PTR__TestConfiguration_02155328;
  local_420._8_8_ = &DAT_100000001;
  uStack_410._0_4_ = 0xde1;
  uStack_410._4_4_ = 0x8cac;
  local_408._0_4_ = 0x8229;
  local_408._4_4_ = 0x2600;
  uStack_400._0_4_ = 0x1902;
  uStack_400._4_4_ = 0x1903;
  local_3f8._0_4_ = 0x100;
  local_3f8._4_4_ = 0x100;
  uStack_3f0._0_4_ = 1;
  uStack_3f0._4_4_ = 0.0;
  local_3e8 = 255.0;
  local_3e4._0_1_ = '\0';
  local_3e4._1_1_ = 0xff;
  local_3e0._0_4_ = 0x1406;
  local_3e0._4_4_ = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DDC32F","Test 7",
             (TestConfiguration<float,_unsigned_char> *)local_420);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_468._0_8_ = &PTR__TestConfiguration_02155528;
  local_468._8_8_ = &DAT_100000001;
  uStack_458._0_4_ = 0xde1;
  uStack_458._4_4_ = 0x81a5;
  local_450._0_4_ = 0x8229;
  local_450._4_4_ = 0x2600;
  uStack_448._0_4_ = 0x1902;
  uStack_448._4_4_ = 0x1903;
  local_440._0_4_ = 0x100;
  local_440._4_4_ = 0x100;
  local_438._0_4_ = 1;
  local_438._4_2_ = 0;
  local_438._6_2_ = 0xff;
  local_430._0_1_ = '\0';
  local_430._1_1_ = 0xff;
  local_42c._0_4_ = 0x1403;
  local_42c._4_4_ = 0x1401;
  pTVar5 = (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::
  TextureBorderClampSamplingTexture
            (pTVar5,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DDC16","Test 7",
             (TestConfiguration<unsigned_short,_unsigned_char> *)local_468);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  local_4b0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_4b0.m_n_in_components = 4;
  local_4b0.m_n_out_components = 4;
  local_4b0.m_target = 0xde1;
  local_4b0.m_input_internal_format = 0x9278;
  local_4b0.m_output_internal_format = 0x8058;
  local_4b0.m_filtering = 0x2600;
  local_4b0.m_input_format = 0x1908;
  local_4b0.m_output_format = 0x1908;
  local_4b0.m_width = 0x40;
  local_4b0.m_height = 0x40;
  local_4b0.m_depth = 1;
  local_4b0.m_init_value = 0.0;
  local_4b0.m_init_border_color = 1.0;
  local_4b0.m_expected_value = '\0';
  local_4b0.m_expected_border_color = 0xff;
  local_4b0.m_input_type = 0x1406;
  local_4b0.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DCompressed",
             "Test 7",&local_4b0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_4f8._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_4f8.m_n_in_components = 4;
  local_4f8.m_n_out_components = 4;
  local_4f8.m_target = 0x8c1a;
  local_4f8.m_input_internal_format = 0x8814;
  local_4f8.m_output_internal_format = 0x8058;
  local_4f8.m_filtering = 0x2600;
  local_4f8.m_input_format = 0x1908;
  local_4f8.m_output_format = 0x1908;
  local_4f8.m_width = 0x100;
  local_4f8.m_height = 0x100;
  local_4f8.m_depth = 6;
  local_4f8.m_init_value = 0.0;
  local_4f8.m_init_border_color = 1.0;
  local_4f8.m_expected_value = '\0';
  local_4f8.m_expected_border_color = 0xff;
  local_4f8.m_input_type = 0x1406;
  local_4f8.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayRGBA32F",
             "Test 7",&local_4f8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_120._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021553a8;
  local_120.m_n_in_components = 1;
  local_120.m_n_out_components = 4;
  local_120.m_target = 0x8c1a;
  local_120.m_input_internal_format = 0x8235;
  local_120.m_output_internal_format = 0x8235;
  local_120.m_filtering = 0x2600;
  local_120.m_input_format = 0x8d94;
  local_120.m_output_format = 0x8d99;
  local_120.m_width = 0x100;
  local_120.m_height = 0x100;
  local_120.m_depth = 6;
  local_120.m_init_value = 0;
  local_120.m_init_border_color = 0xff;
  local_120.m_expected_value = 0;
  local_120.m_expected_border_color = 0xff;
  local_120.m_input_type = 0x1404;
  local_120.m_output_type = 0x1404;
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayR32I",
             "Test 7",&local_120);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_170._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155428;
  local_170.m_n_in_components = 1;
  local_170.m_n_out_components = 4;
  local_170.m_target = 0x8c1a;
  local_170.m_input_internal_format = 0x8236;
  local_170.m_output_internal_format = 0x8236;
  local_170.m_filtering = 0x2600;
  local_170.m_input_format = 0x8d94;
  local_170.m_output_format = 0x8d99;
  local_170.m_width = 0x100;
  local_170.m_height = 0x100;
  local_170.m_depth = 6;
  local_170.m_init_value = 0;
  local_170.m_init_border_color = 0xff;
  local_170.m_expected_value = 0;
  local_170.m_expected_border_color = 0xff;
  local_170.m_input_type = 0x1405;
  local_170.m_output_type = 0x1405;
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayR32UI",
             "Test 7",&local_170);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  local_290._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_290.m_n_in_components = 4;
  local_290.m_n_out_components = 4;
  local_290.m_target = 0x8c1a;
  local_290.m_input_internal_format = 0x8058;
  local_290.m_output_internal_format = 0x8058;
  local_290.m_filtering = 0x2600;
  local_290.m_input_format = 0x1908;
  local_290.m_output_format = 0x1908;
  local_290.m_width = 0x100;
  local_290.m_height = 0x100;
  local_290.m_depth = 6;
  local_290.m_init_value = '\0';
  local_290.m_init_border_color = 0xff;
  local_290.m_expected_value = '\0';
  local_290.m_expected_border_color = 0xff;
  local_290.m_input_type = 0x1401;
  local_290.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayRGBA8",
             "Test 7",&local_290);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_540._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_540.m_n_in_components = 4;
  local_540.m_n_out_components = 4;
  local_540.m_target = 0x8c1a;
  local_540.m_input_internal_format = 0x9278;
  local_540.m_output_internal_format = 0x8058;
  local_540.m_filtering = 0x2600;
  local_540.m_input_format = 0x1908;
  local_540.m_output_format = 0x1908;
  local_540.m_width = 0x40;
  local_540.m_height = 0x40;
  local_540.m_depth = 6;
  local_540.m_init_value = 0.0;
  local_540.m_init_border_color = 1.0;
  local_540.m_expected_value = '\0';
  local_540.m_expected_border_color = 0xff;
  local_540.m_input_type = 0x1406;
  local_540.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayCompressed",
             "Test 7",&local_540);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_588._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_588.m_n_in_components = 4;
  local_588.m_n_out_components = 4;
  local_588.m_target = 0x806f;
  local_588.m_input_internal_format = 0x8814;
  local_588.m_output_internal_format = 0x8058;
  local_588.m_filtering = 0x2600;
  local_588.m_input_format = 0x1908;
  local_588.m_output_format = 0x1908;
  local_588.m_width = 0x100;
  local_588.m_height = 0x100;
  local_588.m_depth = 6;
  local_588.m_init_value = 0.0;
  local_588.m_init_border_color = 1.0;
  local_588.m_expected_value = '\0';
  local_588.m_expected_border_color = 0xff;
  local_588.m_input_type = 0x1406;
  local_588.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DRGBA32F","Test 7",
             &local_588);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_1c0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021553a8;
  local_1c0.m_n_in_components = 1;
  local_1c0.m_n_out_components = 4;
  local_1c0.m_target = 0x806f;
  local_1c0.m_input_internal_format = 0x8235;
  local_1c0.m_output_internal_format = 0x8235;
  local_1c0.m_filtering = 0x2600;
  local_1c0.m_input_format = 0x8d94;
  local_1c0.m_output_format = 0x8d99;
  local_1c0.m_width = 0x100;
  local_1c0.m_height = 0x100;
  local_1c0.m_depth = 6;
  local_1c0.m_init_value = 0;
  local_1c0.m_init_border_color = 0xff;
  local_1c0.m_expected_value = 0;
  local_1c0.m_expected_border_color = 0xff;
  local_1c0.m_input_type = 0x1404;
  local_1c0.m_output_type = 0x1404;
  pTVar2 = (TextureBorderClampSamplingTexture<int,_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<int,_int>::TextureBorderClampSamplingTexture
            (pTVar2,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DR32I","Test 7",
             &local_1c0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_210._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155428;
  local_210.m_n_in_components = 1;
  local_210.m_n_out_components = 4;
  local_210.m_target = 0x806f;
  local_210.m_input_internal_format = 0x8236;
  local_210.m_output_internal_format = 0x8236;
  local_210.m_filtering = 0x2600;
  local_210.m_input_format = 0x8d94;
  local_210.m_output_format = 0x8d99;
  local_210.m_width = 0x100;
  local_210.m_height = 0x100;
  local_210.m_depth = 6;
  local_210.m_init_value = 0;
  local_210.m_init_border_color = 0xff;
  local_210.m_expected_value = 0;
  local_210.m_expected_border_color = 0xff;
  local_210.m_input_type = 0x1405;
  local_210.m_output_type = 0x1405;
  pTVar3 = (TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int> *)operator_new(0x330);
  TextureBorderClampSamplingTexture<unsigned_int,_unsigned_int>::TextureBorderClampSamplingTexture
            (pTVar3,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DR32UI","Test 7",
             &local_210);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  local_2d0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_2d0.m_n_in_components = 4;
  local_2d0.m_n_out_components = 4;
  local_2d0.m_target = 0x806f;
  local_2d0.m_input_internal_format = 0x8058;
  local_2d0.m_output_internal_format = 0x8058;
  local_2d0.m_filtering = 0x2600;
  local_2d0.m_input_format = 0x1908;
  local_2d0.m_output_format = 0x1908;
  local_2d0.m_width = 0x100;
  local_2d0.m_height = 0x100;
  local_2d0.m_depth = 6;
  local_2d0.m_init_value = '\0';
  local_2d0.m_init_border_color = 0xff;
  local_2d0.m_expected_value = '\0';
  local_2d0.m_expected_border_color = 0xff;
  local_2d0.m_input_type = 0x1401;
  local_2d0.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DRGBA8","Test 7",
             &local_2d0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_5d0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_5d0.m_n_in_components = 4;
  local_5d0.m_n_out_components = 4;
  local_5d0.m_target = 0xde1;
  local_5d0.m_input_internal_format = 0x8814;
  local_5d0.m_output_internal_format = 0x8058;
  local_5d0.m_filtering = 0x2601;
  local_5d0.m_input_format = 0x1908;
  local_5d0.m_output_format = 0x1908;
  local_5d0.m_width = 0x100;
  local_5d0.m_height = 0x100;
  local_5d0.m_depth = 1;
  local_5d0.m_init_value = 0.0;
  local_5d0.m_init_border_color = 1.0;
  local_5d0.m_expected_value = '\0';
  local_5d0.m_expected_border_color = 0xff;
  local_5d0.m_input_type = 0x1406;
  local_5d0.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DRGBA32FLinear",
             "Test 7",&local_5d0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_310._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_310.m_n_in_components = 4;
  local_310.m_n_out_components = 4;
  local_310.m_target = 0xde1;
  local_310.m_input_internal_format = 0x8058;
  local_310.m_output_internal_format = 0x8058;
  local_310.m_filtering = 0x2601;
  local_310.m_input_format = 0x1908;
  local_310.m_output_format = 0x1908;
  local_310.m_width = 0x100;
  local_310.m_height = 0x100;
  local_310.m_depth = 1;
  local_310.m_init_value = '\0';
  local_310.m_init_border_color = 0xff;
  local_310.m_expected_value = '\0';
  local_310.m_expected_border_color = 0xff;
  local_310.m_input_type = 0x1401;
  local_310.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DRGBA8Linear",
             "Test 7",&local_310);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_618._0_8_ = &PTR__TestConfiguration_02155328;
  local_618._8_8_ = &DAT_100000001;
  uStack_608._0_4_ = 0xde1;
  uStack_608._4_4_ = 0x8cac;
  local_600._0_4_ = 0x8229;
  local_600._4_4_ = 0x2601;
  uStack_5f8._0_4_ = 0x1902;
  uStack_5f8._4_4_ = 0x1903;
  local_5f0._0_4_ = 0x100;
  local_5f0._4_4_ = 0x100;
  uStack_5e8._0_4_ = 1;
  uStack_5e8._4_4_ = 0.0;
  local_5e0 = 255.0;
  local_5dc._0_1_ = '\0';
  local_5dc._1_1_ = 0xff;
  local_5d8._0_4_ = 0x1406;
  local_5d8._4_4_ = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DDC32FLinear",
             "Test 7",(TestConfiguration<float,_unsigned_char> *)local_618);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_660._0_8_ = &PTR__TestConfiguration_02155528;
  local_660._8_8_ = &DAT_100000001;
  uStack_650._0_4_ = 0xde1;
  uStack_650._4_4_ = 0x81a5;
  local_648._0_4_ = 0x8229;
  local_648._4_4_ = 0x2601;
  uStack_640._0_4_ = 0x1902;
  uStack_640._4_4_ = 0x1903;
  local_638._0_4_ = 0x100;
  local_638._4_4_ = 0x100;
  local_630._0_4_ = 1;
  local_630._4_2_ = 0;
  local_630._6_2_ = 0xff;
  local_628._0_1_ = '\0';
  local_628._1_1_ = 0xff;
  local_624._0_4_ = 0x1403;
  local_624._4_4_ = 0x1401;
  pTVar5 = (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::
  TextureBorderClampSamplingTexture
            (pTVar5,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DDC16Linear",
             "Test 7",(TestConfiguration<unsigned_short,_unsigned_char> *)local_660);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  local_6a8._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_6a8.m_n_in_components = 4;
  local_6a8.m_n_out_components = 4;
  local_6a8.m_target = 0xde1;
  local_6a8.m_input_internal_format = 0x9278;
  local_6a8.m_output_internal_format = 0x8058;
  local_6a8.m_filtering = 0x2601;
  local_6a8.m_input_format = 0x1908;
  local_6a8.m_output_format = 0x1908;
  local_6a8.m_width = 0x40;
  local_6a8.m_height = 0x40;
  local_6a8.m_depth = 1;
  local_6a8.m_init_value = 0.0;
  local_6a8.m_init_border_color = 1.0;
  local_6a8.m_expected_value = '\0';
  local_6a8.m_expected_border_color = 0xff;
  local_6a8.m_input_type = 0x1406;
  local_6a8.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DCompressedLinear",
             "Test 7",&local_6a8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_6f0._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_6f0.m_n_in_components = 4;
  local_6f0.m_n_out_components = 4;
  local_6f0.m_target = 0x8c1a;
  local_6f0.m_input_internal_format = 0x8814;
  local_6f0.m_output_internal_format = 0x8058;
  local_6f0.m_filtering = 0x2601;
  local_6f0.m_input_format = 0x1908;
  local_6f0.m_output_format = 0x1908;
  local_6f0.m_width = 0x100;
  local_6f0.m_height = 0x100;
  local_6f0.m_depth = 6;
  local_6f0.m_init_value = 0.0;
  local_6f0.m_init_border_color = 1.0;
  local_6f0.m_expected_value = '\0';
  local_6f0.m_expected_border_color = 0xff;
  local_6f0.m_input_type = 0x1406;
  local_6f0.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "Texture2DArrayRGBA32FLinear","Test 7",&local_6f0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_350._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_350.m_n_in_components = 4;
  local_350.m_n_out_components = 4;
  local_350.m_target = 0x8c1a;
  local_350.m_input_internal_format = 0x8058;
  local_350.m_output_internal_format = 0x8058;
  local_350.m_filtering = 0x2601;
  local_350.m_input_format = 0x1908;
  local_350.m_output_format = 0x1908;
  local_350.m_width = 0x100;
  local_350.m_height = 0x100;
  local_350.m_depth = 6;
  local_350.m_init_value = '\0';
  local_350.m_init_border_color = 0xff;
  local_350.m_expected_value = '\0';
  local_350.m_expected_border_color = 0xff;
  local_350.m_input_type = 0x1401;
  local_350.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture2DArrayRGBA8Linear",
             "Test 7",&local_350);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_738._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_738.m_n_in_components = 4;
  local_738.m_n_out_components = 4;
  local_738.m_target = 0x8c1a;
  local_738.m_input_internal_format = 0x9278;
  local_738.m_output_internal_format = 0x8058;
  local_738.m_filtering = 0x2601;
  local_738.m_input_format = 0x1908;
  local_738.m_output_format = 0x1908;
  local_738.m_width = 0x40;
  local_738.m_height = 0x40;
  local_738.m_depth = 6;
  local_738.m_init_value = 0.0;
  local_738.m_init_border_color = 1.0;
  local_738.m_expected_value = '\0';
  local_738.m_expected_border_color = 0xff;
  local_738.m_input_type = 0x1406;
  local_738.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,
             "Texture2DArrayCompressedLinear","Test 7",&local_738);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_780._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155328;
  local_780.m_n_in_components = 4;
  local_780.m_n_out_components = 4;
  local_780.m_target = 0x806f;
  local_780.m_input_internal_format = 0x8814;
  local_780.m_output_internal_format = 0x8058;
  local_780.m_filtering = 0x2601;
  local_780.m_input_format = 0x1908;
  local_780.m_output_format = 0x1908;
  local_780.m_width = 0x100;
  local_780.m_height = 0x100;
  local_780.m_depth = 6;
  local_780.m_init_value = 0.0;
  local_780.m_init_border_color = 1.0;
  local_780.m_expected_value = '\0';
  local_780.m_expected_border_color = 0xff;
  local_780.m_input_type = 0x1406;
  local_780.m_output_type = 0x1401;
  pTVar1 = (TextureBorderClampSamplingTexture<float,_unsigned_char> *)operator_new(0x328);
  TextureBorderClampSamplingTexture<float,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DRGBA32FLinear",
             "Test 7",&local_780);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  local_390._vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_021554a8;
  local_390.m_n_in_components = 4;
  local_390.m_n_out_components = 4;
  local_390.m_target = 0x806f;
  local_390.m_input_internal_format = 0x8058;
  local_390.m_output_internal_format = 0x8058;
  local_390.m_filtering = 0x2601;
  local_390.m_input_format = 0x1908;
  local_390.m_output_format = 0x1908;
  local_390.m_width = 0x100;
  local_390.m_height = 0x100;
  local_390.m_depth = 6;
  local_390.m_init_value = '\0';
  local_390.m_init_border_color = 0xff;
  local_390.m_expected_value = '\0';
  local_390.m_expected_border_color = 0xff;
  local_390.m_input_type = 0x1401;
  local_390.m_output_type = 0x1401;
  pTVar4 = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)operator_new(800);
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char>::TextureBorderClampSamplingTexture
            (pTVar4,(this->super_TestCaseGroupBase).m_context,extParams,"Texture3DRGBA8Linear",
             "Test 7",&local_390);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  return extraout_EAX;
}

Assistant:

void TextureBorderClampTests::init(void)
{
	/* Initialize base class */
	TestCaseGroupBase::init();

	/* Texture Border Clamp Border Color Errors (Test 1) */
	addChild(
		new TextureBorderClampParameterBorderColorErrorTest(m_context, m_extParams, "border_color_errors", "Test 1"));

	/* Texture Border Clamp glTexParameterIivEXT(), glTexParameterIuivEXT() Errors (Test 2) */
	addChild(new TextureBorderClampTexParameterIErrorsTest(m_context, m_extParams, "texparameteri_errors", "Test 2"));

	/* Texture Border Clamp glGetTexParameterIivEXT(), glGetTexParameterIuivEXT() Errors (Test 3)*/
	addChild(
		new TextureBorderClampGetTexParameterIErrorsTest(m_context, m_extParams, "gettexparameteri_errors", "Test 3"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non generate sampler (Test 4)*/
	addChild(new TextureBorderClampSamplerParameterIErrorTest(m_context, m_extParams,
															  "samplerparameteri_non_gen_sampler_error", "Test 4"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non generate sampler (Test 5)*/
	addChild(new TextureBorderClampSamplerParameterIWithWrongPnameTest(m_context, m_extParams,
																	   "samplerparameteri_with_wrong_pname", "Test 5"));

	/* Texture Border Clamp glGetSamplerParameterI* and glSamplerParameterI* errors for non GL_TEXTURE_BORDER_COLOR_EXT (Test 6)*/
	addChild(new TextureBorderClampParameterTextureBorderColor(m_context, m_extParams, "samplerparameteri_border_color",
															   "Test 6"));

	/* Texture Border Clamp Sampling Texture (Test 7) */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DRGBA32F(
		4, 4, GL_TEXTURE_2D, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 1, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA32F", "Test 7", configurationTexture2DRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture2DR32I(1, 4, GL_TEXTURE_2D, GL_R32I, GL_R32I,
																		 GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER,
																		 256, 256, 1, 0, 255, 0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture2DR32I",
																		   "Test 7", configurationTexture2DR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture2DR32UI(
		1, 4, GL_TEXTURE_2D, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 1, 0, 255, 0,
		255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(m_context, m_extParams, "Texture2DR32UI",
																			 "Test 7", configurationTexture2DR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DRGBA8(
		4, 4, GL_TEXTURE_2D, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 1, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(m_context, m_extParams, "Texture2DRGBA8",
																			   "Test 7", configurationTexture2DRGBA8));

	/* GL_DEPTH_COMPONENT32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DDC32F(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT32F, GL_R8, GL_NEAREST, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(m_context, m_extParams, "Texture2DDC32F",
																			   "Test 7", configurationTexture2DDC32F));

	/* GL_DEPTH_COMPONENT16 */
	TestConfiguration<glw::GLushort, glw::GLubyte> configurationTexture2DDC16(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT16, GL_R8, GL_NEAREST, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_UNSIGNED_SHORT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLushort, glw::GLubyte>(m_context, m_extParams, "Texture2DDC16",
																				"Test 7", configurationTexture2DDC16));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DCompressed(
		4, 4, GL_TEXTURE_2D, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 64, 64, 1, 0, 1, 0,
		255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DCompressed", "Test 7", configurationTexture2DCompressed));

	/* Target GL_TEXTURE_2D_ARRAY */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayRGBA32F(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA32F", "Test 7", configurationTexture2DArrayRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture2DArrayR32I(
		1, 4, GL_TEXTURE_2D_ARRAY, GL_R32I, GL_R32I, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255,
		0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture2DArrayR32I",
																		   "Test 7", configurationTexture2DArrayR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture2DArrayR32UI(
		1, 4, GL_TEXTURE_2D_ARRAY, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255,
		0, 255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(
		m_context, m_extParams, "Texture2DArrayR32UI", "Test 7", configurationTexture2DArrayR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DArrayRGBA8(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA8", "Test 7", configurationTexture2DArrayRGBA8));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayCompressed(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 64, 64, 6, 0,
		1, 0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayCompressed", "Test 7", configurationTexture2DArrayCompressed));

	/* Target GL_TEXTURE_3D */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture3DRGBA32F(
		4, 4, GL_TEXTURE_3D, GL_RGBA32F, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);
	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA32F", "Test 7", configurationTexture3DRGBA32F));

	/* GL_R32I */
	TestConfiguration<glw::GLint, glw::GLint> configurationTexture3DR32I(1, 4, GL_TEXTURE_3D, GL_R32I, GL_R32I,
																		 GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER,
																		 256, 256, 6, 0, 255, 0, 255, GL_INT, GL_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLint, glw::GLint>(m_context, m_extParams, "Texture3DR32I",
																		   "Test 7", configurationTexture3DR32I));

	/* GL_R32UI */
	TestConfiguration<glw::GLuint, glw::GLuint> configurationTexture3DR32UI(
		1, 4, GL_TEXTURE_3D, GL_R32UI, GL_R32UI, GL_NEAREST, GL_RED_INTEGER, GL_RGBA_INTEGER, 256, 256, 6, 0, 255, 0,
		255, GL_UNSIGNED_INT, GL_UNSIGNED_INT);

	addChild(new TextureBorderClampSamplingTexture<glw::GLuint, glw::GLuint>(m_context, m_extParams, "Texture3DR32UI",
																			 "Test 7", configurationTexture3DR32UI));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture3DRGBA8(
		4, 4, GL_TEXTURE_3D, GL_RGBA8, GL_RGBA8, GL_NEAREST, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(m_context, m_extParams, "Texture3DRGBA8",
																			   "Test 7", configurationTexture3DRGBA8));

	/* Filtering GL_LINEAR */

	/* Target GL_TEXTURE_2D */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DRGBA32FLinear(
		4, 4, GL_TEXTURE_2D, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 1, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA32FLinear", "Test 7", configurationTexture2DRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DRGBA8Linear(
		4, 4, GL_TEXTURE_2D, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 1, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DRGBA8Linear", "Test 7", configurationTexture2DRGBA8Linear));

	/* GL_DEPTH_COMPONENT32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DDC32FLinear(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT32F, GL_R8, GL_LINEAR, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DDC32FLinear", "Test 7", configurationTexture2DDC32FLinear));

	/* GL_DEPTH_COMPONENT16 */
	TestConfiguration<glw::GLushort, glw::GLubyte> configurationTexture2DDC16Linear(
		1, 1, GL_TEXTURE_2D, GL_DEPTH_COMPONENT16, GL_R8, GL_LINEAR, GL_DEPTH_COMPONENT, GL_RED, 256, 256, 1, 0, 255, 0,
		255, GL_UNSIGNED_SHORT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLushort, glw::GLubyte>(
		m_context, m_extParams, "Texture2DDC16Linear", "Test 7", configurationTexture2DDC16Linear));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DCompressedLinear(
		4, 4, GL_TEXTURE_2D, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 64, 64, 1, 0, 1, 0,
		255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DCompressedLinear", "Test 7", configurationTexture2DCompressedLinear));

	/* Target GL_TEXTURE_2D_ARRAY */

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayRGBA32FLinear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA32FLinear", "Test 7", configurationTexture2DArrayRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture2DArrayRGBA8Linear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayRGBA8Linear", "Test 7", configurationTexture2DArrayRGBA8Linear));

	/* GL_COMPRESSED_RGBA8_ETC2_EAC */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture2DArrayCompressedLinear(
		4, 4, GL_TEXTURE_2D_ARRAY, GL_COMPRESSED_RGBA8_ETC2_EAC, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 64, 64, 6, 0, 1,
		0, 255, GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture2DArrayCompressedLinear", "Test 7",
		configurationTexture2DArrayCompressedLinear));

	/* Target GL_TEXTURE_3D*/

	/* GL_RGBA32F */
	TestConfiguration<glw::GLfloat, glw::GLubyte> configurationTexture3DRGBA32FLinear(
		4, 4, GL_TEXTURE_3D, GL_RGBA32F, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0.0f, 1.0f, 0, 255,
		GL_FLOAT, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLfloat, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA32FLinear", "Test 7", configurationTexture3DRGBA32FLinear));

	/* GL_RGBA8 */
	TestConfiguration<glw::GLubyte, glw::GLubyte> configurationTexture3DRGBA8Linear(
		4, 4, GL_TEXTURE_3D, GL_RGBA8, GL_RGBA8, GL_LINEAR, GL_RGBA, GL_RGBA, 256, 256, 6, 0, 255, 0, 255,
		GL_UNSIGNED_BYTE, GL_UNSIGNED_BYTE);

	addChild(new TextureBorderClampSamplingTexture<glw::GLubyte, glw::GLubyte>(
		m_context, m_extParams, "Texture3DRGBA8Linear", "Test 7", configurationTexture3DRGBA8Linear));
}